

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int cvLsDenseDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1)

{
  long *plVar1;
  double dVar2;
  void *pvVar3;
  int iVar4;
  sunindextype sVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  sunrealtype *psVar9;
  long j;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a8;
  long local_a0;
  
  pvVar3 = cv_mem->cv_lmem;
  sVar5 = SUNDenseMatrix_Columns(Jac);
  uVar6 = N_VCloneEmpty(tmp1);
  lVar7 = N_VGetArrayPointer(cv_mem->cv_ewt);
  lVar8 = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet == 0) {
    local_a0 = 0;
  }
  else {
    local_a0 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  dVar10 = cv_mem->cv_uround;
  local_a8 = 0.0;
  if (0.0 < dVar10) {
    if (dVar10 < 0.0) {
      local_a8 = sqrt(dVar10);
    }
    else {
      local_a8 = SQRT(dVar10);
    }
  }
  dVar10 = (double)N_VWrmsNorm(fy,cv_mem->cv_ewt);
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar10 = dVar10 * (double)sVar5 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  else {
    dVar10 = 1.0;
  }
  if (0 < sVar5) {
    j = 0;
    do {
      psVar9 = SUNDenseMatrix_Column(Jac,j);
      N_VSetArrayPointer(psVar9,uVar6);
      dVar2 = *(double *)(lVar8 + j * 8);
      dVar11 = dVar10 / *(double *)(lVar7 + j * 8);
      dVar13 = ABS(dVar2) * local_a8;
      if (ABS(dVar2) * local_a8 <= dVar11) {
        dVar13 = dVar11;
      }
      if (cv_mem->cv_constraintsSet != 0) {
        dVar11 = *(double *)(local_a0 + j * 8);
        dVar12 = ABS(dVar11);
        if ((dVar12 != 1.0) || (NAN(dVar12))) {
          if ((dVar12 == 2.0) && ((!NAN(dVar12) && ((dVar2 + dVar13) * dVar11 <= 0.0))))
          goto LAB_001166c2;
        }
        else if ((dVar2 + dVar13) * dVar11 < 0.0) {
LAB_001166c2:
          dVar13 = -dVar13;
        }
      }
      *(double *)(lVar8 + j * 8) = dVar2 + dVar13;
      iVar4 = (*cv_mem->cv_f)(t,y,tmp1,cv_mem->cv_user_data);
      plVar1 = (long *)((long)pvVar3 + 0x90);
      *plVar1 = *plVar1 + 1;
      if (iVar4 != 0) goto LAB_00116754;
      *(double *)(lVar8 + j * 8) = dVar2;
      N_VLinearSum(1.0 / dVar13,-(1.0 / dVar13),tmp1,fy,uVar6);
      j = j + 1;
    } while (sVar5 != j);
  }
  iVar4 = 0;
LAB_00116754:
  N_VSetArrayPointer(0,uVar6);
  N_VDestroy(uVar6);
  return iVar4;
}

Assistant:

int cvLsDenseDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                   CVodeMem cv_mem, N_Vector tmp1)
{
  sunrealtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  sunrealtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, y */
  ewt_data = N_VGetArrayPointer(cv_mem->cv_ewt);
  y_data   = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(cv_mem->cv_uround);
  fnorm  = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * N * fnorm)
                           : ONE;

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);

    yjsaved = y_data[j];
    inc     = SUNMAX(srur * SUNRabs(yjsaved), minInc / ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (cv_mem->cv_constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yjsaved + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yjsaved + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    y_data[j] += inc;

    retval = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) { break; }

    y_data[j] = yjsaved;

    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}